

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

val eval(c2m_ctx_t c2m_ctx,node_t_conflict tree)

{
  node_t_conflict tree_00;
  ulong uVar1;
  uint uVar2;
  anon_union_8_2_027a474d_for_u aVar3;
  ulong uVar4;
  node_t pnVar5;
  char *pcVar6;
  bool bVar7;
  val vVar8;
  pos_t pVar9;
  val vStack_48;
  val local_38;
  
  switch(tree->code) {
  case N_IGNORE:
    pVar9 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)tree->uid);
    error(c2m_ctx,0x1c15f3,pVar9.fname,pVar9._8_8_);
    goto LAB_001936aa;
  case N_I:
  case N_L:
  case N_LL:
    aVar3 = (anon_union_8_2_027a474d_for_u)(tree->u).s.s;
    goto LAB_001938ee;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    uVar4 = 1;
    aVar3 = (anon_union_8_2_027a474d_for_u)(tree->u).s.s;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    aVar3 = (anon_union_8_2_027a474d_for_u)(long)(tree->u).ch;
    goto LAB_001938ee;
  case N_ANDAND:
  case N_OROR:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    if (tree->code != N_ANDAND) {
      if (vVar8.u.i_val == 0) goto LAB_0019373e;
      aVar3.i_val = 1;
      goto LAB_001938ee;
    }
    if (vVar8.u.i_val != 0) {
LAB_0019373e:
      pnVar5 = (tree->u).ops.head;
      uVar4 = 0;
      if (pnVar5 == (node_t)0x0) {
        pnVar5 = (node_t_conflict)0x0;
      }
      else {
        pnVar5 = (pnVar5->op_link).next;
      }
      vVar8 = eval(c2m_ctx,pnVar5);
      bVar7 = vVar8.u.i_val == 0;
      goto LAB_001938e4;
    }
LAB_001936aa:
    uVar4 = 0;
    aVar3.i_val = 0;
    break;
  case N_EQ:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    bVar7 = vStack_48.u.i_val == CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
    goto LAB_0019353a;
  case N_NE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    bVar7 = vStack_48.u.i_val == CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
LAB_001938e4:
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ = !bVar7;
    break;
  case N_LT:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar3.i_val._1_7_ = 0;
      aVar3.i_val._0_1_ =
           vStack_48.u.u_val < CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
      break;
    }
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ =
         vStack_48.u.i_val < (long)CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
    goto LAB_001938ee;
  case N_LE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar3.i_val._1_7_ = 0;
      aVar3.i_val._0_1_ =
           vStack_48.u.u_val <= CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
      break;
    }
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ =
         vStack_48.u.i_val <= (long)CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
    goto LAB_001938ee;
  case N_GT:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar3.i_val._1_7_ = 0;
      aVar3.i_val._0_1_ =
           CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) < vStack_48.u.u_val;
      break;
    }
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ =
         (long)CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) < vStack_48.u.i_val;
    goto LAB_001938ee;
  case N_GE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar3.i_val._1_7_ = 0;
      aVar3.i_val._0_1_ =
           CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) <= vStack_48.u.u_val;
      break;
    }
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ =
         (long)CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) <= vStack_48.u.i_val;
    goto LAB_001938ee;
  case N_BITWISE_NOT:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    uVar4 = (ulong)(uint)vVar8.uns_p;
    aVar3.u_val = ~vVar8.u.u_val;
    break;
  case N_NOT:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    uVar2 = vVar8.uns_p;
    bVar7 = vVar8.u.i_val == 0;
LAB_0019353a:
    uVar4 = (ulong)uVar2;
    aVar3.i_val._1_7_ = 0;
    aVar3.i_val._0_1_ = bVar7;
    break;
  case N_AND:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    aVar3.u_val = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) & vStack_48.u.u_val;
    break;
  case N_OR:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    aVar3.u_val = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) | vStack_48.u.u_val;
    break;
  case N_XOR:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    aVar3.u_val = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) ^ vStack_48.u.u_val;
    break;
  case N_LSH:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    aVar3.u_val = vStack_48.u.u_val << ((ulong)(byte)local_38.u.u_val._0_1_ & 0x3f);
    break;
  case N_RSH:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar3.u_val = vStack_48.u.u_val >> ((ulong)(byte)local_38.u.u_val._0_1_ & 0x3f);
      break;
    }
    aVar3.i_val = vStack_48.u.i_val >> ((ulong)(byte)local_38.u.u_val._0_1_ & 0x3f);
LAB_001938ee:
    uVar4 = 0;
    break;
  case N_ADD:
    pnVar5 = (tree->u).ops.head;
    if ((pnVar5 != (node_t)0x0) && ((pnVar5->op_link).next != (node_t)0x0)) {
      uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
      uVar4 = (ulong)uVar2;
      aVar3.i_val = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) + vStack_48.u.i_val;
      break;
    }
    goto LAB_001938c6;
  case N_SUB:
    tree_00 = (tree->u).ops.head;
    if ((tree_00 == (node_t_conflict)0x0) || ((tree_00->op_link).next == (node_t)0x0)) {
      vVar8 = eval(c2m_ctx,tree_00);
      uVar4 = (ulong)(uint)vVar8.uns_p;
      aVar3.i_val = -vVar8.u.i_val;
    }
    else {
      uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
      uVar4 = (ulong)uVar2;
      aVar3.i_val = vStack_48.u.i_val - CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
    }
    break;
  case N_MUL:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar4 = (ulong)uVar2;
    aVar3.i_val = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_) * vStack_48.u.i_val;
    break;
  case N_DIV:
  case N_MOD:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&vStack_48,&local_38);
    uVar1 = CONCAT71(local_38.u.i_val._1_7_,local_38.u.i_val._0_1_);
    uVar4 = (ulong)uVar2;
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        aVar3.i_val = vStack_48.u.i_val % (long)uVar1;
        if (tree->code == N_DIV) {
          aVar3.i_val = vStack_48.u.i_val / (long)uVar1;
        }
        goto LAB_001938ee;
      }
    }
    else if (uVar1 != 0) {
      aVar3.u_val = vStack_48.u.u_val % uVar1;
      if (tree->code == N_DIV) {
        aVar3.u_val = vStack_48.u.u_val / uVar1;
      }
      break;
    }
    pVar9 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)tree->uid);
    pcVar6 = "%";
    if (tree->code == N_DIV) {
      pcVar6 = "/";
    }
    error(c2m_ctx,0x1c1611,pVar9.fname,pVar9._8_8_,pcVar6);
    aVar3.i_val = 1;
    break;
  case N_COND:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    pnVar5 = (tree->u).ops.head;
    if (pnVar5 == (node_t)0x0) {
      pnVar5 = (node_t_conflict)0x0;
    }
    else {
      uVar2 = (uint)(vVar8.u.i_val == 0);
      do {
        pnVar5 = (pnVar5->op_link).next;
        bVar7 = uVar2 != 0;
        uVar2 = uVar2 - 1;
        if (pnVar5 == (node_t)0x0) break;
      } while (bVar7);
    }
LAB_001938c6:
    vVar8 = eval(c2m_ctx,pnVar5);
    uVar4 = (ulong)(uint)vVar8.uns_p;
    aVar3.i_val = vVar8.u.i_val;
  }
  vVar8.u.i_val = aVar3.i_val;
  vVar8._0_8_ = uVar4;
  return vVar8;
}

Assistant:

static struct val eval (c2m_ctx_t c2m_ctx, node_t tree) {
  int cond;
  struct val res, v1, v2;

#define UNOP(op)                                \
  do {                                          \
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops)); \
    res = v1;                                   \
    if (res.uns_p)                              \
      res.u.u_val = op res.u.u_val;             \
    else                                        \
      res.u.i_val = op res.u.i_val;             \
  } while (0)

#define BINOP(op)                                              \
  do {                                                         \
    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2); \
    if (res.uns_p)                                             \
      res.u.u_val = v1.u.u_val op v2.u.u_val;                  \
    else                                                       \
      res.u.i_val = v1.u.i_val op v2.u.i_val;                  \
  } while (0)

  switch (tree->code) {
  case N_IGNORE:
    error (c2m_ctx, POS (tree), "wrong preprocessor expression");
    res.uns_p = FALSE;
    res.u.i_val = 0;
    break;
  case N_CH:
    res.uns_p = !char_is_signed_p () || MIR_CHAR_MAX > MIR_INT_MAX;
    if (res.uns_p)
      res.u.u_val = tree->u.ch;
    else
      res.u.i_val = tree->u.ch;
    break;
  case N_CH16:
  case N_CH32:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_I:
  case N_L:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.l;
    break;
  case N_LL:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.ll;
    break;
  case N_U:
  case N_UL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_ULL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ull;
    break;
  case N_BITWISE_NOT: UNOP (~); break;
  case N_NOT: UNOP (!); break;
  case N_EQ: BINOP (==); break;
  case N_NE: BINOP (!=); break;
  case N_LT: BINOP (<); break;
  case N_LE: BINOP (<=); break;
  case N_GT: BINOP (>); break;
  case N_GE: BINOP (>=); break;
  case N_ADD:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (+);
    } else {
      BINOP (+);
    }
    break;
  case N_SUB:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (-);
    } else {
      BINOP (-);
    }
    break;
  case N_AND: BINOP (&); break;
  case N_OR: BINOP (|); break;
  case N_XOR: BINOP (^); break;
  case N_LSH: BINOP (<<); break;
  case N_RSH: BINOP (>>); break;
  case N_MUL: BINOP (*); break;
  case N_DIV:
  case N_MOD: {
    int zero_p;

    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2);
    if (res.uns_p) {
      res.u.u_val = ((zero_p = v2.u.u_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.u_val / v2.u.u_val
                                                : v1.u.u_val % v2.u.u_val);
    } else {
      res.u.i_val = ((zero_p = v2.u.i_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.i_val / v2.u.i_val
                                                : v1.u.i_val % v2.u.i_val);
    }
    if (zero_p)
      error (c2m_ctx, POS (tree), "division (%s) by zero in preporocessor",
             tree->code == N_DIV ? "/" : "%");
    break;
  }
  case N_ANDAND:
  case N_OROR:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    if (tree->code == N_ANDAND ? cond : !cond) {
      v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
      cond = v2.uns_p ? v2.u.u_val != 0 : v2.u.i_val != 0;
    }
    res.uns_p = FALSE;
    res.u.i_val = cond;
    break;
  case N_COND:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    res = eval (c2m_ctx, NL_EL (tree->u.ops, cond ? 1 : 2));
    break;
  default:
    res.uns_p = FALSE;
    res.u.i_val = 0;
    assert (FALSE);
  }
  return res;
}